

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::AJoint::Solve(AJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  float fVar1;
  Body *this_01;
  btVector3 bVar2;
  btVector3 bVar3;
  float local_d8;
  float local_c8;
  float fStack_c4;
  btVector3 local_90;
  Impulse local_80;
  Impulse local_58;
  
  this_01 = (this->super_Joint).m_bodies;
  bVar2 = Body::angularVelocity(this_01);
  this_00 = (this->super_Joint).m_bodies + 1;
  bVar3 = Body::angularVelocity(this_00);
  local_d8 = bVar2.m_floats[2];
  local_d8 = local_d8 - bVar3.m_floats[2];
  local_c8 = bVar2.m_floats[0];
  fStack_c4 = bVar2.m_floats[1];
  local_c8 = local_c8 - bVar3.m_floats[0];
  fStack_c4 = fStack_c4 - bVar3.m_floats[1];
  local_58.m_velocity.m_floats[0] =
       (btScalar)
       (**(code **)(*(long *)this->m_icontrol + 0x18))
                 (this->m_axis[0].m_floats[2] * local_d8 +
                  this->m_axis[0].m_floats[0] * local_c8 + fStack_c4 * this->m_axis[0].m_floats[1],
                  this->m_icontrol,this);
  bVar2 = operator*(this->m_axis,(btScalar *)&local_58);
  local_58.m_drift.m_floats[0] = 0.0;
  local_58.m_drift.m_floats[1] = 0.0;
  local_58.m_drift.m_floats[2] = 0.0;
  local_58.m_drift.m_floats[3] = 0.0;
  local_58._32_1_ = 1;
  fVar1 = (this->super_Joint).m_cfm;
  local_90.m_floats[1] = fVar1 * (fStack_c4 - bVar2.m_floats[1]);
  local_90.m_floats[0] = fVar1 * (local_c8 - bVar2.m_floats[0]);
  local_90.m_floats[2] = (local_d8 - bVar2.m_floats[2]) * fVar1;
  local_90.m_floats[3] = 0.0;
  local_80.m_velocity = operator+(&(this->super_Joint).m_drift,&local_90);
  bVar2 = operator*(&(this->super_Joint).m_massmatrix,&local_80.m_velocity);
  local_58.m_velocity.m_floats[1] = sor * bVar2.m_floats[1];
  local_58.m_velocity.m_floats[0] = sor * bVar2.m_floats[0];
  local_58.m_velocity.m_floats[2] = bVar2.m_floats[2] * sor;
  local_58.m_velocity.m_floats[3] = 0.0;
  Impulse::operator-(&local_80,&local_58);
  Body::applyAImpulse(this_01,&local_80);
  Body::applyAImpulse(this_00,&local_58);
  return;
}

Assistant:

void				btSoftBody::AJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].angularVelocity();
	const btVector3		vb=m_bodies[1].angularVelocity();
	const btVector3		vr=va-vb;
	const btScalar		sp=btDot(vr,m_axis[0]);
	const btVector3		vc=vr-m_axis[0]*m_icontrol->Speed(this,sp);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vc*m_cfm)*sor;
	m_bodies[0].applyAImpulse(-impulse);
	m_bodies[1].applyAImpulse( impulse);
}